

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

void Diligent::InputLayoutDesc_To_VkVertexInputStateCI
               (InputLayoutDesc *LayoutDesc,VkPipelineVertexInputStateCreateInfo *VertexInputStateCI
               ,VkPipelineVertexInputDivisorStateCreateInfoEXT *VertexInputDivisorCI,
               array<VkVertexInputBindingDescription,_16UL> *BindingDescriptions,
               array<VkVertexInputAttributeDescription,_16UL> *AttributeDescription,
               array<VkVertexInputBindingDivisorDescription,_16UL> *VertexBindingDivisors)

{
  VkVertexInputBindingDescription *pVVar1;
  uint32_t uVar2;
  LayoutElement *pLVar3;
  VkVertexInputRate VVar4;
  uint uVar5;
  VkVertexInputRate VVar6;
  VkFormat VVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint32_t *puVar11;
  string msg;
  array<int,_16UL> BufferSlot2BindingDescInd;
  string local_b8;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *local_98;
  array<VkVertexInputBindingDivisorDescription,_16UL> *local_90;
  VkPipelineVertexInputStateCreateInfo *local_88;
  InputLayoutDesc *local_80;
  uint32_t local_78 [18];
  
  VertexInputStateCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  VertexInputStateCI->pNext = (void *)0x0;
  VertexInputStateCI->flags = 0;
  VertexInputStateCI->vertexBindingDescriptionCount = 0;
  VertexInputStateCI->pVertexBindingDescriptions = BindingDescriptions->_M_elems;
  uVar2 = LayoutDesc->NumElements;
  VertexInputStateCI->vertexAttributeDescriptionCount = uVar2;
  VertexInputStateCI->pVertexAttributeDescriptions = AttributeDescription->_M_elems;
  VertexInputDivisorCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO;
  VertexInputDivisorCI->pNext = (void *)0x0;
  VertexInputDivisorCI->vertexBindingDivisorCount = 0;
  VertexInputDivisorCI->pVertexBindingDivisors = VertexBindingDivisors->_M_elems;
  local_78[0xc] = 0xffffffff;
  local_78[0xd] = 0xffffffff;
  local_78[0xe] = 0xffffffff;
  local_78[0xf] = 0xffffffff;
  local_78[8] = 0xffffffff;
  local_78[9] = 0xffffffff;
  local_78[10] = 0xffffffff;
  local_78[0xb] = 0xffffffff;
  local_78[4] = 0xffffffff;
  local_78[5] = 0xffffffff;
  local_78[6] = 0xffffffff;
  local_78[7] = 0xffffffff;
  local_78[0] = 0xffffffff;
  local_78[1] = 0xffffffff;
  local_78[2] = 0xffffffff;
  local_78[3] = 0xffffffff;
  if (uVar2 != 0) {
    puVar11 = &AttributeDescription->_M_elems[0].offset;
    lVar10 = 0x24;
    uVar8 = 0;
    local_98 = VertexInputDivisorCI;
    local_90 = VertexBindingDivisors;
    local_88 = VertexInputStateCI;
    local_80 = LayoutDesc;
    do {
      pLVar3 = local_80->LayoutElements;
      uVar5 = *(uint *)((long)pLVar3 + lVar10 + -0x18);
      lVar9 = (long)(int)local_78[uVar5];
      if (lVar9 < 0) {
        uVar2 = local_88->vertexBindingDescriptionCount;
        lVar9 = (long)(int)uVar2;
        local_88->vertexBindingDescriptionCount = uVar2 + 1;
        local_78[uVar5] = uVar2;
        BindingDescriptions->_M_elems[lVar9].binding = uVar5;
        BindingDescriptions->_M_elems[lVar9].stride = *(uint32_t *)((long)pLVar3 + lVar10 + -8);
        VVar4 = LayoutElemFrequencyToVkInputRate
                          (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar3 + lVar10 + -4));
        BindingDescriptions->_M_elems[lVar9].inputRate = VVar4;
        uVar5 = *(uint *)((long)pLVar3 + lVar10 + -0x18);
      }
      if (BindingDescriptions->_M_elems[lVar9].binding != uVar5) {
        FormatString<char[25]>(&local_b8,(char (*) [25])"Inconsistent buffer slot");
        DebugAssertionFailed
                  (local_b8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      pVVar1 = BindingDescriptions->_M_elems + lVar9;
      if (pVVar1->stride != *(uint32_t *)((long)pLVar3 + lVar10 + -8)) {
        FormatString<char[21]>(&local_b8,(char (*) [21])"Inconsistent strides");
        DebugAssertionFailed
                  (local_b8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      VVar4 = pVVar1->inputRate;
      VVar6 = LayoutElemFrequencyToVkInputRate
                        (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar3 + lVar10 + -4));
      if (VVar4 != VVar6) {
        FormatString<char[38]>(&local_b8,(char (*) [38])"Inconsistent layout element frequency");
        DebugAssertionFailed
                  (local_b8._M_dataplus._M_p,"InputLayoutDesc_To_VkVertexInputStateCI",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x40f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      puVar11[-2] = pVVar1->binding;
      ((VkVertexInputAttributeDescription *)(puVar11 + -3))->location =
           *(uint32_t *)((long)pLVar3 + lVar10 + -0x1c);
      VVar7 = TypeToVkFormat(*(VALUE_TYPE *)((long)pLVar3 + lVar10 + -0x10),
                             *(Uint32 *)((long)pLVar3 + lVar10 + -0x14),
                             *(Bool *)((long)pLVar3 + lVar10 + -0xf));
      puVar11[-1] = VVar7;
      *puVar11 = *(uint32_t *)((long)pLVar3 + lVar10 + -0xc);
      if ((*(char *)((long)pLVar3 + lVar10 + -4) == '\x02') &&
         (uVar2 = *(uint32_t *)((long)&pLVar3->HLSLSemantic + lVar10), uVar2 != 1)) {
        uVar5 = local_98->vertexBindingDivisorCount;
        local_98->vertexBindingDivisorCount = uVar5 + 1;
        local_90->_M_elems[uVar5].binding = pVVar1->binding;
        local_90->_M_elems[uVar5].divisor = uVar2;
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x28;
      puVar11 = puVar11 + 4;
    } while (uVar8 < local_80->NumElements);
  }
  return;
}

Assistant:

void InputLayoutDesc_To_VkVertexInputStateCI(const InputLayoutDesc&                                                      LayoutDesc,
                                             VkPipelineVertexInputStateCreateInfo&                                       VertexInputStateCI,
                                             VkPipelineVertexInputDivisorStateCreateInfoEXT&                             VertexInputDivisorCI,
                                             std::array<VkVertexInputBindingDescription, MAX_LAYOUT_ELEMENTS>&           BindingDescriptions,
                                             std::array<VkVertexInputAttributeDescription, MAX_LAYOUT_ELEMENTS>&         AttributeDescription,
                                             std::array<VkVertexInputBindingDivisorDescriptionEXT, MAX_LAYOUT_ELEMENTS>& VertexBindingDivisors)
{
    // Vertex input description
    VertexInputStateCI.sType                           = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    VertexInputStateCI.pNext                           = nullptr;
    VertexInputStateCI.flags                           = 0; // reserved for future use.
    VertexInputStateCI.vertexBindingDescriptionCount   = 0;
    VertexInputStateCI.pVertexBindingDescriptions      = BindingDescriptions.data();
    VertexInputStateCI.vertexAttributeDescriptionCount = LayoutDesc.NumElements;
    VertexInputStateCI.pVertexAttributeDescriptions    = AttributeDescription.data();

    VertexInputDivisorCI.sType                     = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT;
    VertexInputDivisorCI.pNext                     = nullptr;
    VertexInputDivisorCI.vertexBindingDivisorCount = 0;
    VertexInputDivisorCI.pVertexBindingDivisors    = VertexBindingDivisors.data();

    std::array<Int32, MAX_LAYOUT_ELEMENTS> BufferSlot2BindingDescInd;
    BufferSlot2BindingDescInd.fill(-1);
    for (Uint32 elem = 0; elem < LayoutDesc.NumElements; ++elem)
    {
        const LayoutElement& LayoutElem     = LayoutDesc.LayoutElements[elem];
        Int32&               BindingDescInd = BufferSlot2BindingDescInd[LayoutElem.BufferSlot];
        if (BindingDescInd < 0)
        {
            BindingDescInd = VertexInputStateCI.vertexBindingDescriptionCount++;
            VkVertexInputBindingDescription& BindingDesc{BindingDescriptions[BindingDescInd]};
            BindingDesc.binding   = LayoutElem.BufferSlot;
            BindingDesc.stride    = LayoutElem.Stride;
            BindingDesc.inputRate = LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency);
        }

        const VkVertexInputBindingDescription& BindingDesc = BindingDescriptions[BindingDescInd];
        VERIFY(BindingDesc.binding == LayoutElem.BufferSlot, "Inconsistent buffer slot");
        VERIFY(BindingDesc.stride == LayoutElem.Stride, "Inconsistent strides");
        VERIFY(BindingDesc.inputRate == LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency), "Inconsistent layout element frequency");

        VkVertexInputAttributeDescription& AttribDesc{AttributeDescription[elem]};
        AttribDesc.binding  = BindingDesc.binding;
        AttribDesc.location = LayoutElem.InputIndex;
        AttribDesc.format   = TypeToVkFormat(LayoutElem.ValueType, LayoutElem.NumComponents, LayoutElem.IsNormalized);
        AttribDesc.offset   = LayoutElem.RelativeOffset;

        if (LayoutElem.Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE && LayoutElem.InstanceDataStepRate != 1)
        {
            VkVertexInputBindingDivisorDescriptionEXT& AttribDivisor{VertexBindingDivisors[VertexInputDivisorCI.vertexBindingDivisorCount++]};
            AttribDivisor.binding = BindingDesc.binding;
            AttribDivisor.divisor = LayoutElem.InstanceDataStepRate;
        }
    }
}